

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  secp256k1_scalar *r;
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  uint32_t uVar3;
  uint32_t uVar4;
  int extraout_EAX_00;
  int extraout_EAX_01;
  ulong uVar5;
  secp256k1_gej *psVar6;
  secp256k1_gej *psVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  secp256k1_scalar *a;
  int iVar12;
  secp256k1_ge *psVar13;
  long lVar14;
  secp256k1_gej *unaff_RBP;
  secp256k1_gej *psVar15;
  secp256k1_fe *psVar16;
  secp256k1_ge *psVar17;
  secp256k1_ge *a_00;
  secp256k1_fe *a_01;
  secp256k1_fe *psVar18;
  secp256k1_gej *r_00;
  ulong uVar19;
  uint64_t *puVar20;
  secp256k1_ge *psVar21;
  uint64_t *puVar22;
  secp256k1_gej *psVar23;
  int iVar24;
  secp256k1_gej *psVar25;
  secp256k1_gej *psVar26;
  long unaff_R13;
  secp256k1_ge *psVar27;
  secp256k1_gej *psVar28;
  bool bVar29;
  byte bVar30;
  secp256k1_fe t;
  secp256k1_fe sStack_1080;
  undefined1 auStack_1050 [144];
  undefined1 auStack_fc0 [112];
  secp256k1_ge sStack_f50;
  secp256k1_fe asStack_eb8 [31];
  secp256k1_ge sStack_8d0;
  secp256k1_fe asStack_838 [31];
  secp256k1_ge *psStack_248;
  secp256k1_gej *psStack_240;
  long lStack_238;
  secp256k1_ge *psStack_230;
  secp256k1_gej *psStack_228;
  secp256k1_gej *psStack_220;
  undefined8 uStack_210;
  undefined1 auStack_208 [48];
  ulong uStack_1d8;
  secp256k1_ge *psStack_1d0;
  uint64_t uStack_1c8;
  uint64_t auStack_1c0 [4];
  secp256k1_modinv64_trans2x2 sStack_1a0;
  secp256k1_ge *psStack_180;
  secp256k1_gej *psStack_178;
  undefined1 auStack_150 [56];
  ulong uStack_118;
  ulong uStack_110;
  uint64_t uStack_108;
  uint64_t uStack_100;
  int iStack_f8;
  int iStack_f4;
  secp256k1_modinv64_signed62 sStack_f0;
  secp256k1_fe sStack_c8;
  secp256k1_fe *psStack_98;
  secp256k1_ge *psStack_90;
  undefined1 local_88 [48];
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  int local_30;
  int local_2c;
  
  bVar30 = 0;
  psVar13 = (secp256k1_ge *)local_88;
  psVar18 = (secp256k1_fe *)local_88;
  psVar16 = (secp256k1_fe *)local_88;
  psVar28 = (secp256k1_gej *)0xfffffffffffff;
  psStack_90 = (secp256k1_ge *)0x148812;
  secp256k1_fe_verify(xd);
  uVar5 = (xd->n[4] >> 0x30) * 0x1000003d1 + xd->n[0];
  if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar5 & 0xfffffffffffff) == 0)) {
    uVar11 = (uVar5 >> 0x34) + xd->n[1];
    psVar17 = (secp256k1_ge *)((uVar11 >> 0x34) + xd->n[2]);
    a_01 = (secp256k1_fe *)(((ulong)psVar17 >> 0x34) + xd->n[3]);
    uVar19 = ((ulong)a_01 >> 0x34) + (xd->n[4] & 0xffffffffffff);
    psVar26 = (secp256k1_gej *)0x1000003d0;
    if ((((uVar11 | uVar5 | (ulong)psVar17 | (ulong)a_01) & 0xfffffffffffff) == 0 && uVar19 == 0) ||
       (((uVar5 | 0x1000003d0) & uVar11 & (ulong)psVar17 & (ulong)a_01 & (uVar19 ^ 0xf000000000000))
        == 0xfffffffffffff)) goto LAB_00148a0a;
  }
  psVar28 = (secp256k1_gej *)&stack0xffffffffffffffa8;
  psStack_90 = (secp256k1_ge *)0x1488cb;
  secp256k1_fe_mul((secp256k1_fe *)psVar28,xd,xn);
  psStack_90 = (secp256k1_ge *)0x1488d9;
  secp256k1_fe_sqr((secp256k1_fe *)local_88,xn);
  psStack_90 = (secp256k1_ge *)0x1488e7;
  secp256k1_fe_mul((secp256k1_fe *)psVar28,(secp256k1_fe *)psVar28,(secp256k1_fe *)local_88);
  psStack_90 = (secp256k1_ge *)0x1488f2;
  secp256k1_fe_sqr((secp256k1_fe *)local_88,xd);
  psStack_90 = (secp256k1_ge *)0x1488fd;
  secp256k1_fe_sqr((secp256k1_fe *)local_88,(secp256k1_fe *)local_88);
  psStack_90 = (secp256k1_ge *)0x148905;
  secp256k1_fe_verify((secp256k1_fe *)local_88);
  if ((int)local_88._40_4_ < 5) {
    local_88._40_4_ = local_88._40_4_ * 7;
    psVar17 = (secp256k1_ge *)(local_88._0_8_ * 7);
    local_88._8_8_ = local_88._8_8_ * 7;
    local_88._16_8_ = local_88._16_8_ * 7;
    local_88._24_8_ = local_88._24_8_ * 7;
    local_88._32_8_ = local_88._32_8_ * 7;
    local_88._44_4_ = 0;
    psStack_90 = (secp256k1_ge *)0x14898e;
    local_88._0_8_ = psVar17;
    secp256k1_fe_verify((secp256k1_fe *)local_88);
    xn = (secp256k1_fe *)&stack0xffffffffffffffa8;
    psStack_90 = (secp256k1_ge *)0x14899b;
    secp256k1_fe_verify(xn);
    psStack_90 = (secp256k1_ge *)0x1489a3;
    secp256k1_fe_verify((secp256k1_fe *)local_88);
    local_30 = local_88._40_4_ + local_30;
    xd = (secp256k1_fe *)local_88;
    a_01 = psVar16;
    if (local_30 < 0x21) {
      local_58 = (long)((secp256k1_fe *)local_88._0_8_)->n + local_58;
      uStack_50 = uStack_50 + local_88._8_8_;
      local_48 = local_48 + local_88._16_8_;
      uStack_40 = uStack_40 + local_88._24_8_;
      local_38 = local_38 + local_88._32_8_;
      local_2c = 0;
      psStack_90 = (secp256k1_ge *)0x1489ec;
      secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffffa8);
      psStack_90 = (secp256k1_ge *)0x1489f4;
      iVar1 = secp256k1_fe_is_square_var((secp256k1_fe *)&stack0xffffffffffffffa8);
      return iVar1;
    }
  }
  else {
    psStack_90 = (secp256k1_ge *)0x148a05;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
    psVar17 = psVar13;
    a_01 = psVar18;
  }
  psStack_90 = (secp256k1_ge *)0x148a0a;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psVar26 = (secp256k1_gej *)local_88;
LAB_00148a0a:
  psStack_90 = (secp256k1_ge *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_frac_on_curve_var_cold_1();
  psStack_90 = (secp256k1_ge *)xn;
  psStack_98 = xd;
  r_00 = (secp256k1_gej *)auStack_150;
  psVar6 = (secp256k1_gej *)auStack_150;
  psVar13 = (secp256k1_ge *)auStack_150;
  auStack_150._48_8_ = a_01->n[0];
  uStack_118 = a_01->n[1];
  uStack_110 = a_01->n[2];
  uStack_108 = a_01->n[3];
  uStack_100 = a_01->n[4];
  iStack_f8 = a_01->magnitude;
  iStack_f4 = a_01->normalized;
  secp256k1_fe_verify(a_01);
  auStack_150._0_8_ = a_01->n[0];
  auStack_150._8_8_ = a_01->n[1];
  auStack_150._16_8_ = a_01->n[2];
  auStack_150._24_8_ = a_01->n[3];
  auStack_150._32_8_ = a_01->n[4];
  auStack_150._40_4_ = a_01->magnitude;
  auStack_150._44_4_ = a_01->normalized;
  secp256k1_fe_normalize_var((secp256k1_fe *)auStack_150);
  secp256k1_fe_verify((secp256k1_fe *)auStack_150);
  if (auStack_150._44_4_ == 0) {
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((auStack_150._16_8_ == 0 && auStack_150._24_8_ == 0) &&
        (auStack_150._8_8_ == 0 && auStack_150._0_8_ == 0)) && auStack_150._32_8_ == 0) {
      psVar13 = (secp256k1_ge *)0x1;
    }
    else {
      sStack_f0.v[0] = (auStack_150._8_8_ << 0x34 | auStack_150._0_8_) & 0x3fffffffffffffff;
      sStack_f0.v[1] =
           (ulong)((uint)auStack_150._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_150._8_8_ >> 10;
      sStack_f0.v[2] =
           (ulong)((uint)auStack_150._24_8_ & 0x3fffffff) << 0x20 |
           (ulong)auStack_150._16_8_ >> 0x14;
      sStack_f0.v[3] =
           (auStack_150._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_150._24_8_ >> 0x1e;
      sStack_f0.v[4] = (ulong)auStack_150._32_8_ >> 0x28;
      uVar2 = secp256k1_jacobi64_maybe_var(&sStack_f0,&secp256k1_const_modinfo_fe);
      if (uVar2 == 0) {
        uVar2 = secp256k1_fe_sqrt(&sStack_c8,(secp256k1_fe *)auStack_150);
        psVar13 = (secp256k1_ge *)(ulong)uVar2;
      }
      else {
        psVar13 = (secp256k1_ge *)(ulong)(~uVar2 >> 0x1f);
      }
    }
    xn = (secp256k1_fe *)(auStack_150 + 0x30);
    secp256k1_fe_verify(xn);
    auStack_150._48_8_ = (uStack_100 >> 0x30) * 0x1000003d1 + auStack_150._48_8_;
    uStack_118 = ((ulong)auStack_150._48_8_ >> 0x34) + uStack_118;
    uStack_110 = (uStack_118 >> 0x34) + uStack_110;
    uVar5 = (uStack_110 >> 0x34) + uStack_108;
    uStack_108 = uVar5 & 0xfffffffffffff;
    uStack_100 = (uVar5 >> 0x34) + (uStack_100 & 0xffffffffffff);
    uStack_110 = uStack_110 & 0xfffffffffffff;
    uStack_118 = uStack_118 & 0xfffffffffffff;
    auStack_150._48_8_ = auStack_150._48_8_ & 0xfffffffffffff;
    iStack_f8 = 1;
    secp256k1_fe_verify(xn);
    psVar17 = (secp256k1_ge *)xn;
    iVar1 = secp256k1_fe_sqrt((secp256k1_fe *)auStack_150,xn);
    r_00 = psVar6;
    if ((int)psVar13 == iVar1) {
      return (int)psVar13;
    }
  }
  secp256k1_fe_is_square_var_cold_1();
  psStack_178 = psVar26;
  psStack_180 = psVar13;
  auStack_1c0[3] = (psVar17->x).n[4];
  auStack_1c0[1] = (psVar17->x).n[2];
  auStack_1c0[2] = (psVar17->x).n[3];
  uStack_1c8 = (psVar17->x).n[0];
  auStack_1c0[0] = (psVar17->x).n[1];
  auStack_208._0_8_ = (r_00->x).n[0];
  auStack_208._8_8_ = (r_00->x).n[1];
  auStack_208._16_8_ = (r_00->x).n[2];
  auStack_208._24_8_ = (r_00->x).n[3];
  auStack_208._32_8_ = (r_00->x).n[4];
  a_00 = psVar17;
  if (((((long)auStack_208._0_8_ < 0) || ((long)auStack_208._8_8_ < 0)) ||
      (psVar13 = psVar17, a_00 = (secp256k1_ge *)auStack_208._16_8_, (long)auStack_208._16_8_ < 0))
     || ((r_00 = (secp256k1_gej *)auStack_208._24_8_, (long)auStack_208._24_8_ < 0 ||
         ((long)auStack_208._32_8_ < 0)))) {
LAB_00149085:
    psStack_220 = (secp256k1_gej *)0x14908a;
    secp256k1_jacobi64_maybe_var_cold_18();
LAB_0014908a:
    psStack_220 = (secp256k1_gej *)0x14908f;
    secp256k1_jacobi64_maybe_var_cold_11();
LAB_0014908f:
    psStack_220 = (secp256k1_gej *)0x149094;
    secp256k1_jacobi64_maybe_var_cold_10();
LAB_00149094:
    psStack_220 = (secp256k1_gej *)0x149099;
    secp256k1_jacobi64_maybe_var_cold_9();
LAB_00149099:
    psStack_220 = (secp256k1_gej *)0x14909e;
    secp256k1_jacobi64_maybe_var_cold_8();
    psVar17 = psVar13;
    psVar27 = (secp256k1_ge *)xn;
  }
  else {
    a_00 = (secp256k1_ge *)
           (auStack_208._16_8_ | auStack_208._24_8_ | auStack_208._8_8_ | auStack_208._0_8_ |
           auStack_208._32_8_);
    psVar27 = (secp256k1_ge *)xn;
    if (a_00 != (secp256k1_ge *)0x0) {
      xn = (secp256k1_fe *)0x5;
      unaff_R13 = -1;
      uStack_1d8 = 0;
      unaff_RBP = (secp256k1_gej *)0x0;
      auStack_208._40_8_ = psVar17;
      do {
        psVar13 = (secp256k1_ge *)auStack_208._40_8_;
        r_00 = (secp256k1_gej *)(auStack_1c0[0] << 0x3e | uStack_1c8);
        puVar20 = (uint64_t *)(auStack_208._8_8_ << 0x3e | auStack_208._0_8_);
        psVar6 = (secp256k1_gej *)0x0;
        psVar21 = (secp256k1_ge *)0x0;
        psVar26 = (secp256k1_gej *)0x1;
        iVar1 = 0x3e;
        psVar27 = (secp256k1_ge *)0x1;
        puVar22 = puVar20;
        psVar25 = r_00;
        while( true ) {
          uVar5 = -1L << ((byte)iVar1 & 0x3f) | (ulong)puVar22;
          lVar14 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          bVar8 = (byte)lVar14;
          psVar23 = (secp256k1_gej *)((ulong)puVar22 >> (bVar8 & 0x3f));
          psVar27 = (secp256k1_ge *)((long)psVar27 << (bVar8 & 0x3f));
          psVar6 = (secp256k1_gej *)((long)psVar6 << (bVar8 & 0x3f));
          unaff_R13 = unaff_R13 - lVar14;
          a_00 = (secp256k1_ge *)((ulong)psVar25 >> 2);
          uVar2 = ((uint)((ulong)psVar25 >> 1) ^ (uint)a_00) & (uint)lVar14 ^ (uint)unaff_RBP;
          psVar28 = (secp256k1_gej *)(ulong)uVar2;
          iVar1 = iVar1 - (uint)lVar14;
          psStack_1d0 = (secp256k1_ge *)xn;
          if (iVar1 == 0) break;
          if (((ulong)psVar25 & 1) == 0) {
            psStack_220 = (secp256k1_gej *)0x149053;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00149053:
            psStack_220 = (secp256k1_gej *)0x149058;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00149058:
            psStack_220 = (secp256k1_gej *)0x14905d;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_0014905d:
            psStack_220 = (secp256k1_gej *)0x149062;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00149062;
          }
          if (((ulong)psVar23 & 1) == 0) goto LAB_00149053;
          a_00 = (secp256k1_ge *)((long)psVar6 * (long)puVar20 + (long)psVar27 * (long)r_00);
          bVar8 = 0x3e - (char)iVar1;
          psVar17 = (secp256k1_ge *)((long)psVar25 << (bVar8 & 0x3f));
          if (a_00 != psVar17) goto LAB_00149058;
          psVar17 = (secp256k1_ge *)((long)psVar26 * (long)puVar20 + (long)psVar21 * (long)r_00);
          a_00 = (secp256k1_ge *)((long)psVar23 << (bVar8 & 0x3f));
          if (psVar17 != a_00) goto LAB_0014905d;
          iVar24 = (int)psVar25;
          iVar12 = (int)psVar23;
          if (unaff_R13 < 0) {
            unaff_R13 = -unaff_R13;
            iVar9 = (int)unaff_R13 + 1;
            if (iVar1 <= iVar9) {
              iVar9 = iVar1;
            }
            a_00 = (secp256k1_ge *)(ulong)(iVar9 - 0x3fU);
            if (0xffffffc1 < iVar9 - 0x3fU) {
              unaff_RBP = (secp256k1_gej *)
                          (ulong)(uVar2 ^ (uint)(((ulong)psVar23 & (ulong)psVar25) >> 1));
              psVar17 = (secp256k1_ge *)
                        ((ulong)(0x3fL << (-(char)iVar9 & 0x3fU)) >> (-(char)iVar9 & 0x3fU));
              uVar2 = (iVar12 * iVar12 + 0x3e) * iVar12 * iVar24 & (uint)psVar17;
              psVar7 = psVar6;
              psVar6 = psVar26;
              psVar15 = psVar23;
              a_00 = psVar27;
              psVar27 = psVar21;
              goto LAB_00148e3d;
            }
            goto LAB_0014906c;
          }
          iVar9 = (int)unaff_R13 + 1;
          if (iVar1 <= iVar9) {
            iVar9 = iVar1;
          }
          a_00 = (secp256k1_ge *)(ulong)(iVar9 - 0x3fU);
          if (iVar9 - 0x3fU < 0xffffffc2) goto LAB_00149067;
          psVar17 = (secp256k1_ge *)
                    ((ulong)(0xfL << (-(char)iVar9 & 0x3fU)) >> (-(char)iVar9 & 0x3fU));
          uVar2 = -(iVar12 * ((iVar24 * 2 + 2U & 8) + iVar24)) & (uint)psVar17;
          psVar7 = psVar26;
          psVar15 = psVar25;
          a_00 = psVar21;
          psVar25 = psVar23;
          unaff_RBP = psVar28;
LAB_00148e3d:
          uVar5 = (ulong)uVar2;
          puVar22 = (uint64_t *)((long)(psVar25->x).n + uVar5 * (long)psVar15);
          psVar21 = (secp256k1_ge *)((long)(a_00->x).n + (long)psVar27 * uVar5);
          psVar26 = (secp256k1_gej *)((long)(psVar7->x).n + uVar5 * (long)psVar6);
          psVar25 = psVar15;
          psVar28 = unaff_RBP;
          if (((ulong)puVar22 & (ulong)psVar17) != 0) {
LAB_00149062:
            psStack_220 = (secp256k1_gej *)0x149067;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00149067:
            psStack_220 = (secp256k1_gej *)0x14906c;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_0014906c:
            psStack_220 = (secp256k1_gej *)0x149071;
            secp256k1_jacobi64_maybe_var_cold_5();
            psVar13 = psVar17;
            xn = &psVar27->x;
            goto LAB_00149071;
          }
        }
        r_00 = SUB168(SEXT816((long)psVar6) * SEXT816((long)psVar21),8);
        uVar5 = (long)psVar27 * (long)psVar26 - (long)psVar6 * (long)psVar21;
        uVar11 = (SUB168(SEXT816((long)psVar27) * SEXT816((long)psVar26),8) - (long)r_00) -
                 (ulong)((ulong)((long)psVar27 * (long)psVar26) <
                        (ulong)((long)psVar6 * (long)psVar21));
        a_00 = (secp256k1_ge *)(~uVar11 | uVar5 ^ 0xc000000000000000);
        unaff_RBP = (secp256k1_gej *)auStack_208;
        sStack_1a0.u = (int64_t)psVar27;
        sStack_1a0.v = (int64_t)psVar6;
        sStack_1a0.q = (int64_t)psVar21;
        sStack_1a0.r = (int64_t)psVar26;
        if ((a_00 != (secp256k1_ge *)0x0) && (uVar5 != 0x4000000000000000 || uVar11 != 0))
        goto LAB_001490a3;
        psVar26 = (secp256k1_gej *)&uStack_1c8;
        iVar12 = (int)xn;
        psStack_220 = (secp256k1_gej *)0x148eeb;
        a_00 = (secp256k1_ge *)xn;
        r_00 = psVar26;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar26,iVar12,
                           (secp256k1_modinv64_signed62 *)auStack_208._40_8_,0);
        if (iVar1 < 1) {
LAB_00149071:
          psStack_220 = (secp256k1_gej *)0x149076;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00149076:
          psStack_220 = (secp256k1_gej *)0x14907b;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_0014907b:
          psStack_220 = (secp256k1_gej *)0x149080;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00149080:
          psStack_220 = (secp256k1_gej *)0x149085;
          secp256k1_jacobi64_maybe_var_cold_12();
          goto LAB_00149085;
        }
        psStack_220 = (secp256k1_gej *)0x148f06;
        a_00 = (secp256k1_ge *)xn;
        r_00 = psVar26;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar26,iVar12,
                           (secp256k1_modinv64_signed62 *)psVar13,1);
        if (0 < iVar1) goto LAB_00149076;
        psStack_220 = (secp256k1_gej *)0x148f1e;
        a_00 = (secp256k1_ge *)xn;
        r_00 = unaff_RBP;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar12,
                           (secp256k1_modinv64_signed62 *)psVar13,0);
        if (iVar1 < 1) goto LAB_0014907b;
        psStack_220 = (secp256k1_gej *)0x148f39;
        a_00 = (secp256k1_ge *)xn;
        r_00 = unaff_RBP;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar12,
                           (secp256k1_modinv64_signed62 *)psVar13,1);
        if (-1 < iVar1) goto LAB_00149080;
        psStack_220 = (secp256k1_gej *)0x148f54;
        secp256k1_modinv64_update_fg_62_var
                  (iVar12,(secp256k1_modinv64_signed62 *)psVar26,
                   (secp256k1_modinv64_signed62 *)unaff_RBP,&sStack_1a0);
        if (uStack_1c8 == 1) {
          if (1 < iVar12) {
            psVar17 = (secp256k1_ge *)0x1;
            uVar5 = 0;
            do {
              uVar5 = uVar5 | auStack_1c0[(long)&psVar17[-1].field_0x67];
              psVar17 = (secp256k1_ge *)((long)(psVar17->x).n + 1);
            } while ((secp256k1_ge *)xn != psVar17);
            if (uVar5 != 0) goto LAB_00148f86;
          }
          uStack_210._4_4_ = 1 - (uVar2 * 2 & 2);
          bVar29 = false;
        }
        else {
LAB_00148f86:
          lVar14 = (long)iVar12;
          if ((-1 < lVar14 + -2 && (&psStack_1d0)[lVar14] == (secp256k1_ge *)0x0) &&
              (&uStack_210)[lVar14] == 0) {
            xn = (secp256k1_fe *)(ulong)(iVar12 - 1);
          }
          psStack_220 = (secp256k1_gej *)0x148fb3;
          iVar12 = (int)xn;
          a_00 = (secp256k1_ge *)xn;
          r_00 = psVar26;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar26,iVar12,
                             (secp256k1_modinv64_signed62 *)psVar13,0);
          if (iVar1 < 1) goto LAB_0014908a;
          psStack_220 = (secp256k1_gej *)0x148fce;
          a_00 = (secp256k1_ge *)xn;
          r_00 = psVar26;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar26,iVar12,
                             (secp256k1_modinv64_signed62 *)psVar13,1);
          if (0 < iVar1) goto LAB_0014908f;
          psStack_220 = (secp256k1_gej *)0x148fe6;
          a_00 = (secp256k1_ge *)xn;
          r_00 = unaff_RBP;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar12,
                             (secp256k1_modinv64_signed62 *)psVar13,0);
          if (iVar1 < 1) goto LAB_00149094;
          psStack_220 = (secp256k1_gej *)0x149001;
          a_00 = (secp256k1_ge *)xn;
          r_00 = unaff_RBP;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar12,
                             (secp256k1_modinv64_signed62 *)psVar13,1);
          bVar29 = true;
          if (-1 < iVar1) goto LAB_00149099;
        }
        if (!bVar29) {
          return uStack_210._4_4_;
        }
        uVar2 = (int)uStack_1d8 + 1;
        uStack_1d8 = (ulong)uVar2;
        psVar17 = psVar13;
        unaff_RBP = psVar28;
        if (uVar2 == 0xc) {
          return 0;
        }
      } while( true );
    }
  }
  psStack_220 = (secp256k1_gej *)0x1490a3;
  secp256k1_jacobi64_maybe_var_cold_17();
LAB_001490a3:
  psStack_220 = (secp256k1_gej *)secp256k1_ecmult_const;
  secp256k1_jacobi64_maybe_var_cold_16();
  psStack_248 = psVar17;
  psStack_240 = psVar26;
  lStack_238 = unaff_R13;
  psStack_230 = psVar27;
  psStack_228 = psVar28;
  psStack_220 = unaff_RBP;
  secp256k1_ge_verify(a_00);
  if (a_00->infinity != 0) {
    secp256k1_gej_set_infinity(r_00);
    return extraout_EAX;
  }
  r = (secp256k1_scalar *)(auStack_fc0 + 0x50);
  secp256k1_scalar_add(r,a,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(r,r);
  psVar28 = (secp256k1_gej *)(auStack_1050 + 0x70);
  secp256k1_scalar_split_lambda((secp256k1_scalar *)auStack_fc0,(secp256k1_scalar *)psVar28,r);
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_fc0,(secp256k1_scalar *)auStack_fc0,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar26 = psVar28;
  secp256k1_scalar_add
            ((secp256k1_scalar *)psVar28,(secp256k1_scalar *)psVar28,
             &secp256k1_ecmult_const::S_OFFSET);
  uVar5 = 0x81;
  do {
    psVar6 = (secp256k1_gej *)auStack_fc0;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_fc0);
    if ((*(ulong *)(auStack_fc0 + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) != 0) {
      secp256k1_ecmult_const_cold_1();
LAB_00149575:
      secp256k1_ecmult_const_cold_2();
      goto LAB_0014957a;
    }
    psVar6 = psVar28;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar28);
    if ((*(ulong *)(auStack_fc0 + (uVar5 >> 6) * 8 + -0x20) >> ((uint)uVar5 & 0x3f) & 1) != 0)
    goto LAB_00149575;
    uVar2 = (uint)uVar5 + 1;
    uVar5 = (ulong)uVar2;
  } while (uVar2 != 0x100);
  secp256k1_gej_set_ge(r_00,a_00);
  secp256k1_ecmult_odd_multiples_table
            (0x10,&sStack_8d0,&sStack_f50.x,(secp256k1_fe *)(auStack_fc0 + 0x20),r_00);
  secp256k1_ge_table_set_globalz(0x10,&sStack_8d0,&sStack_f50.x);
  lVar14 = 0;
  do {
    secp256k1_ge_mul_lambda
              ((secp256k1_ge *)((long)sStack_f50.x.n + lVar14),
               (secp256k1_ge *)((long)sStack_8d0.x.n + lVar14));
    lVar14 = lVar14 + 0x68;
  } while (lVar14 != 0x680);
  psVar18 = (secp256k1_fe *)(auStack_1050 + 0x30);
  iVar1 = 0x19;
  while( true ) {
    uVar2 = iVar1 * 5;
    uVar3 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)auStack_fc0,uVar2,5);
    psVar6 = (secp256k1_gej *)(auStack_1050 + 0x70);
    psVar26 = (secp256k1_gej *)(ulong)uVar2;
    uVar4 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psVar6,uVar2,5);
    uVar2 = uVar3 >> 4 ^ 1;
    if (0x1f < uVar3) break;
    auStack_1050._32_8_ = sStack_8d0.x.n[4];
    auStack_1050._40_4_ = sStack_8d0.x.magnitude;
    auStack_1050._44_4_ = sStack_8d0.x.normalized;
    auStack_1050._16_8_ = sStack_8d0.x.n[2];
    auStack_1050._24_8_ = sStack_8d0.x.n[3];
    auStack_1050._0_8_ = sStack_8d0.x.n[0];
    auStack_1050._8_8_ = sStack_8d0.x.n[1];
    auStack_1050._80_8_ = sStack_8d0.y.n[4];
    auStack_1050._88_4_ = sStack_8d0.y.magnitude;
    auStack_1050._92_4_ = sStack_8d0.y.normalized;
    auStack_1050._64_8_ = sStack_8d0.y.n[2];
    auStack_1050._72_8_ = sStack_8d0.y.n[3];
    auStack_1050._48_8_ = sStack_8d0.y.n[0];
    auStack_1050._56_8_ = sStack_8d0.y.n[1];
    uVar5 = 1;
    psVar16 = asStack_838;
    do {
      uVar10 = (uint)(((uVar3 ^ -uVar2) & 0xf) == uVar5);
      secp256k1_fe_cmov((secp256k1_fe *)auStack_1050,psVar16 + -1,uVar10);
      secp256k1_fe_cmov(psVar18,psVar16,uVar10);
      uVar5 = uVar5 + 1;
      psVar16 = (secp256k1_fe *)(psVar16[2].n + 1);
    } while (uVar5 != 0x10);
    auStack_1050._96_4_ = 0;
    secp256k1_fe_verify(psVar18);
    secp256k1_fe_verify_magnitude(psVar18,1);
    sStack_1080.n[0] = 0x3ffffbfffff0bc - auStack_1050._48_8_;
    sStack_1080.n[1] = 0x3ffffffffffffc - auStack_1050._56_8_;
    sStack_1080.n[2] = 0x3ffffffffffffc - auStack_1050._64_8_;
    sStack_1080.n[3] = 0x3ffffffffffffc - auStack_1050._72_8_;
    sStack_1080.n[4] = 0x3fffffffffffc - auStack_1050._80_8_;
    sStack_1080.magnitude = 2;
    sStack_1080.normalized = 0;
    secp256k1_fe_verify(&sStack_1080);
    secp256k1_fe_cmov(psVar18,&sStack_1080,uVar2);
    psVar6 = r_00;
    if (iVar1 == 0x19) {
      psVar26 = (secp256k1_gej *)auStack_1050;
      secp256k1_gej_set_ge(r_00,(secp256k1_ge *)auStack_1050);
    }
    else {
      iVar12 = 5;
      do {
        secp256k1_gej_double(r_00,r_00);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      psVar26 = r_00;
      secp256k1_gej_add_ge(r_00,r_00,(secp256k1_ge *)auStack_1050);
    }
    uVar2 = uVar4 >> 4 ^ 1;
    if (0x1f < uVar4) goto LAB_0014957f;
    auStack_1050._32_8_ = sStack_f50.x.n[4];
    auStack_1050._40_4_ = sStack_f50.x.magnitude;
    auStack_1050._44_4_ = sStack_f50.x.normalized;
    auStack_1050._16_8_ = sStack_f50.x.n[2];
    auStack_1050._24_8_ = sStack_f50.x.n[3];
    auStack_1050._0_8_ = sStack_f50.x.n[0];
    auStack_1050._8_8_ = sStack_f50.x.n[1];
    auStack_1050._80_8_ = sStack_f50.y.n[4];
    auStack_1050._88_4_ = sStack_f50.y.magnitude;
    auStack_1050._92_4_ = sStack_f50.y.normalized;
    auStack_1050._64_8_ = sStack_f50.y.n[2];
    auStack_1050._72_8_ = sStack_f50.y.n[3];
    auStack_1050._48_8_ = sStack_f50.y.n[0];
    auStack_1050._56_8_ = sStack_f50.y.n[1];
    uVar5 = 1;
    psVar16 = asStack_eb8;
    do {
      uVar10 = (uint)(((uVar4 ^ -uVar2) & 0xf) == uVar5);
      secp256k1_fe_cmov((secp256k1_fe *)auStack_1050,psVar16 + -1,uVar10);
      secp256k1_fe_cmov(psVar18,psVar16,uVar10);
      uVar5 = uVar5 + 1;
      psVar16 = (secp256k1_fe *)(psVar16[2].n + 1);
    } while (uVar5 != 0x10);
    auStack_1050._96_4_ = 0;
    secp256k1_fe_verify(psVar18);
    secp256k1_fe_verify_magnitude(psVar18,1);
    sStack_1080.n[0] = 0x3ffffbfffff0bc - auStack_1050._48_8_;
    sStack_1080.n[1] = 0x3ffffffffffffc - auStack_1050._56_8_;
    sStack_1080.n[2] = 0x3ffffffffffffc - auStack_1050._64_8_;
    sStack_1080.n[3] = 0x3ffffffffffffc - auStack_1050._72_8_;
    sStack_1080.n[4] = 0x3fffffffffffc - auStack_1050._80_8_;
    sStack_1080.magnitude = 2;
    sStack_1080.normalized = 0;
    secp256k1_fe_verify(&sStack_1080);
    secp256k1_fe_cmov(psVar18,&sStack_1080,uVar2);
    secp256k1_gej_add_ge(r_00,r_00,(secp256k1_ge *)auStack_1050);
    bVar29 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar29) {
      secp256k1_fe_mul(&r_00->z,&r_00->z,(secp256k1_fe *)(auStack_fc0 + 0x20));
      return extraout_EAX_00;
    }
  }
LAB_0014957a:
  secp256k1_ecmult_const_cold_4();
LAB_0014957f:
  secp256k1_ecmult_const_cold_3();
  secp256k1_ge_verify((secp256k1_ge *)psVar26);
  psVar28 = psVar6;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    (psVar28->x).n[0] = (psVar26->x).n[0];
    psVar26 = (secp256k1_gej *)((long)psVar26 + (ulong)bVar30 * -0x10 + 8);
    psVar28 = (secp256k1_gej *)((long)psVar28 + (ulong)bVar30 * -0x10 + 8);
  }
  secp256k1_fe_mul(&psVar6->x,&psVar6->x,&secp256k1_const_beta);
  secp256k1_ge_verify((secp256k1_ge *)psVar6);
  return extraout_EAX_01;
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));

     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}